

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O1

idx_t __thiscall
duckdb::StandardColumnData::Scan
          (StandardColumnData *this,TransactionData transaction,idx_t vector_index,
          ColumnScanState *state,Vector *result,idx_t target_count)

{
  ScanVectorType scan_type;
  idx_t scan_count;
  reference state_00;
  idx_t scan_count_00;
  StandardColumnData *this_00;
  ColumnData *this_01;
  
  this_00 = this;
  scan_type = (*(this->super_ColumnData)._vptr_ColumnData[5])(this,state,target_count);
  scan_count = ColumnData::ScanVector
                         (&this_00->super_ColumnData,state,result,target_count,scan_type,0);
  if (scan_type != SCAN_ENTIRE_VECTOR) {
    ColumnData::FetchUpdates
              (&this->super_ColumnData,transaction,vector_index,result,scan_count,true,false);
  }
  this_01 = (ColumnData *)&state->child_states;
  state_00 = vector<duckdb::ColumnScanState,_true>::operator[]
                       ((vector<duckdb::ColumnScanState,_true> *)this_01,0);
  scan_count_00 = ColumnData::ScanVector(this_01,state_00,result,target_count,scan_type,0);
  if (scan_type != SCAN_ENTIRE_VECTOR) {
    ColumnData::FetchUpdates
              (&(this->validity).super_ColumnData,transaction,vector_index,result,scan_count_00,true
               ,false);
  }
  return scan_count;
}

Assistant:

idx_t StandardColumnData::Scan(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                               idx_t target_count) {
	D_ASSERT(state.row_index == state.child_states[0].row_index);
	auto scan_type = GetVectorScanType(state, target_count, result);
	auto mode = ScanVectorMode::REGULAR_SCAN;
	auto scan_count = ScanVector(transaction, vector_index, state, result, target_count, scan_type, mode);
	validity.ScanVector(transaction, vector_index, state.child_states[0], result, target_count, scan_type, mode);
	return scan_count;
}